

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginLoopFixedGroupLastIterationInst::Exec
          (BeginLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  Label LVar4;
  GroupInfo *pGVar5;
  undefined4 *puVar6;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  char *pcVar7;
  
  pGVar5 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  if (pGVar5->length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xde7,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar3) goto LAB_00d4e8fe;
    *puVar6 = 0;
  }
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops == true) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo,
               matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::ResetGroupCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    iVar1 = (this->super_GroupMixin).groupId;
    pcVar7[8] = '\x03';
    *(undefined ***)pcVar7 = &PTR_Print_013e0248;
    *(int *)(pcVar7 + 0xc) = iVar1;
    Matcher::PushStats(matcher,contStack,input);
  }
  origLoopInfo->number = 0;
  origLoopInfo->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((BeginLoopFixedGroupLastIterationInst *)*instPointer != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xe06,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
      if (!bVar3) {
LAB_00d4e8fe:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    LVar4 = Matcher::InstPointerToLabel(matcher,*instPointer);
    pcVar7[8] = '\n';
    *(undefined ***)pcVar7 = &PTR_Print_013e0398;
    *(Label *)(pcVar7 + 0xc) = LVar4;
    pcVar7[0x10] = '\x01';
    Matcher::PushStats(matcher,contStack,input);
  }
  *instPointer = *instPointer + 0x1c;
  return false;
}

Assistant:

inline bool BeginLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixedGroupLastIteration entry
        // for this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // If loop is contained in an outer loop or assertion, we must reset the group binding if we backtrack all the way out
        if (!noNeedToSave)
        {
            PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            // CHOICEPOINT: Try one iteration of body. Failure of body will rewind input to here and resume with follow.
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopFixedGroupLastIterationCont, matcher.InstPointerToLabel(instPointer), true);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: Must match minimum iterations, so continue to loop body. Failure of body signals failure of entire loop.

        instPointer += sizeof(*this);
        return false;
    }